

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_tips.cpp
# Opt level: O1

vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *
handlegraph::algorithms::head_nodes(HandleGraph *g)

{
  long *in_RSI;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_RDI;
  undefined1 **local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  undefined1 local_28 [8];
  undefined1 *local_20 [2];
  
  local_20[0] = local_28;
  (in_RDI->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = local_20;
  uStack_40 = 0;
  pcStack_30 = std::
               _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  (**(code **)(*in_RSI + 0x98))();
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return in_RDI;
}

Assistant:

vector<handle_t> head_nodes(const HandleGraph* g) {
    vector<handle_t> to_return;
    g->for_each_handle([&](const handle_t& found) {
        // For each (locally forward) node
        
        bool no_left_edges = true;
        g->follow_edges(found, true, [&](const handle_t& ignored) {
            // We found a left edge!
            no_left_edges = false;
            // We only need one
            return false;
        });
        
        if (no_left_edges) {
            to_return.push_back(found);
        }
    });
    
    return to_return;
    
}